

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::DisplayFinalEntries(cmComputeLinkDepends *this)

{
  pointer __lhs;
  pointer pLVar1;
  ulong uVar2;
  FILE *pFVar3;
  bool bVar4;
  undefined8 in_RAX;
  string *psVar5;
  char *pcVar6;
  pointer pcVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  undefined4 uStack_38;
  char space [3];
  
  pFVar3 = _stderr;
  _uStack_38 = in_RAX;
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  fprintf(pFVar3,"target [%s] links to:\n",(psVar5->_M_dataplus)._M_p);
  uVar2 = _uStack_38 >> 0x30;
  _uStack_38 = CONCAT24(0x2020,uStack_38);
  _uStack_38 = CONCAT26((short)uVar2,_uStack_38) & 0xff00ffffffffffff;
  pLVar1 = (this->FinalLinkEntries).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar8 = 2;
  for (__lhs_00 = &((this->FinalLinkEntries).
                    super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start)->Feature; pFVar3 = _stderr,
      __lhs = (pointer)(__lhs_00 + -2), __lhs != pLVar1; __lhs_00 = __lhs_00 + 3) {
    if (*(int *)((long)&__lhs_00[-1].field_2 + 8) == 4) {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"<LINK_GROUP>");
      pcVar6 = "end";
      if (bVar4) {
        pcVar6 = "start";
      }
      fprintf(pFVar3,"  %s group",pcVar6);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"<LINK_GROUP>");
      iVar8 = (uint)bVar4 * 2 + 2;
    }
    else {
      if ((cmGeneratorTarget *)__lhs_00[-1].field_2._M_allocated_capacity ==
          (cmGeneratorTarget *)0x0) {
        pcVar7 = (__lhs->Item).Value._M_dataplus._M_p;
        pcVar6 = "%*sitem [%s]";
      }
      else {
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((cmGeneratorTarget *)__lhs_00[-1].field_2._M_allocated_capacity);
        pcVar7 = (psVar5->_M_dataplus)._M_p;
        pcVar6 = "%*starget [%s]";
      }
      fprintf(pFVar3,pcVar6,iVar8,space,pcVar7);
    }
    bVar4 = std::operator!=(__lhs_00,&LinkEntry::DEFAULT_abi_cxx11_);
    if (bVar4) {
      fprintf(_stderr,", feature [%s]",(__lhs_00->_M_dataplus)._M_p);
    }
    fputc(10,_stderr);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayFinalEntries()
{
  fprintf(stderr, "target [%s] links to:\n", this->Target->GetName().c_str());
  char space[] = "  ";
  int count = 2;
  for (LinkEntry const& lei : this->FinalLinkEntries) {
    if (lei.Kind == LinkEntry::Group) {
      fprintf(stderr, "  %s group",
              lei.Item.Value == "<LINK_GROUP>" ? "start" : "end");
      count = lei.Item.Value == "<LINK_GROUP>" ? 4 : 2;
    } else if (lei.Target) {
      fprintf(stderr, "%*starget [%s]", count, space,
              lei.Target->GetName().c_str());
    } else {
      fprintf(stderr, "%*sitem [%s]", count, space, lei.Item.Value.c_str());
    }
    if (lei.Feature != LinkEntry::DEFAULT) {
      fprintf(stderr, ", feature [%s]", lei.Feature.c_str());
    }
    fprintf(stderr, "\n");
  }
  fprintf(stderr, "\n");
}